

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringBuffer.cc
# Opt level: O1

void __thiscall StringBuffer::appendBuffer(StringBuffer *this,char *buffer,long length)

{
  char cVar1;
  ulong uVar2;
  unsigned_long uVar3;
  char *pcVar4;
  size_t sVar5;
  size_t sVar6;
  
  if (length < 1) {
    length = strlen(buffer);
  }
  if (0 < length) {
    uVar2 = this->saLength;
    if (uVar2 < this->sLength + length) {
      sVar5 = uVar2 >> 3;
      if ((long)(uVar2 >> 3) < sbDefaultBoost) {
        sVar5 = sbDefaultBoost;
      }
      if ((long)sVar5 <= length) {
        sVar5 = length;
      }
      this->saLength = sVar5 + uVar2;
      pcVar4 = (char *)realloc(this->sData,sVar5 + uVar2 + 1);
      this->sData = pcVar4;
    }
    sVar5 = 1;
    if (1 < length) {
      sVar5 = length;
    }
    sVar6 = 0;
    do {
      cVar1 = buffer[sVar6];
      uVar3 = this->sLength;
      this->sLength = uVar3 + 1;
      this->sData[uVar3] = cVar1;
      sVar6 = sVar6 + 1;
    } while (sVar5 != sVar6);
    this->sData[this->sLength] = '\0';
  }
  return;
}

Assistant:

void StringBuffer::appendBuffer(const char *buffer, const long length) {
  long addThis, pl = length > 0 ? length : strlen(buffer);

  if (pl > 0) {
    if (saLength < sLength + pl) {
      addThis = saLength / 8;

      if (StringBuffer::sbDefaultBoost > addThis)
        addThis = StringBuffer::sbDefaultBoost;
      if (addThis < pl)
        addThis = pl;

      saLength += addThis;
      sData = (char *)realloc(sData, sizeof(char) * (saLength + 1));
    }
    for (addThis = 0; addThis < pl; addThis++)
      sData[sLength++] = buffer[addThis];

    sData[sLength] = 0;
  }
}